

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnumValue
          (DescriptorBuilder *this,EnumValueDescriptorProto *proto,EnumDescriptor *parent,
          EnumValueDescriptor *result)

{
  Symbol symbol;
  bool bVar1;
  bool bVar2;
  string *psVar3;
  long *plVar4;
  OptionsType *orig_options;
  size_type *psVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  Symbol symbol_00;
  string outer_scope;
  anon_union_8_7_bfa3a334_for_Symbol_2 in_stack_fffffffffffffef0;
  _Alloc_hider _Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar3 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
  *(string **)result = psVar3;
  *(int32 *)(result + 0x10) = proto->number_;
  *(EnumDescriptor **)(result + 0x18) = parent;
  psVar3 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(parent + 8));
  std::__cxx11::string::resize
            ((ulong)psVar3,
             (char)psVar3->_M_string_length - (char)*(undefined8 *)(*(long *)parent + 8));
  std::__cxx11::string::_M_append((char *)psVar3,**(ulong **)result);
  *(string **)(result + 8) = psVar3;
  ValidateSymbolName(this,proto->name_,psVar3,&proto->super_Message);
  if ((proto->_has_bits_[0] & 4) == 0) {
    *(undefined8 *)(result + 0x20) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (OptionsType *)0x0) {
      orig_options = *(OptionsType **)(EnumValueDescriptorProto::default_instance_ + 0x18);
    }
    AllocateOptionsImpl<google::protobuf::EnumValueDescriptor>
              (this,*(string **)(result + 8),*(string **)(result + 8),orig_options,result);
  }
  symbol.field_1.descriptor = in_stack_fffffffffffffef0.descriptor;
  symbol._0_8_ = result;
  bVar1 = AddSymbol(this,*(string **)(result + 8),*(void **)(parent + 0x18),*(string **)result,
                    &proto->super_Message,symbol);
  symbol_00.field_1.enum_value_descriptor = result;
  symbol_00._0_8_ = 4;
  bVar2 = FileDescriptorTables::AddAliasUnderParent
                    (this->file_tables_,parent,(string *)**(undefined8 **)result,symbol_00);
  if ((!bVar1) && (bVar2)) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&local_f0);
    if (local_f0._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_f0,0,(char *)0x0,0x24add4);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffef0,"\"",&local_f0);
      plVar4 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffef0);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0.field_2._8_8_ = plVar4[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_d0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffef0.descriptor != &local_100) {
        operator_delete(in_stack_fffffffffffffef0.descriptor,local_100._M_allocated_capacity + 1);
      }
    }
    psVar3 = *(string **)(result + 8);
    std::operator+(&local_50,
                   "Note that enum values use C++ scoping rules, meaning that enum values are siblings of their type, not children of it.  Therefore, \""
                   ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)result);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = &local_a0;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_a0 = *plVar6;
      lStack_98 = plVar4[3];
    }
    else {
      local_a0 = *plVar6;
      local_b0 = (long *)*plVar4;
    }
    local_a8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)local_f0._M_dataplus._M_p);
    local_90 = &local_80;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_70,**(ulong **)parent);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar7) {
      local_100._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_100._8_8_ = plVar4[3];
      _Var8._M_p = (pointer)&local_100;
    }
    else {
      local_100._M_allocated_capacity = paVar7->_M_allocated_capacity;
      _Var8._M_p = (pointer)*plVar4;
    }
    *plVar4 = (long)paVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffef0);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = plVar4[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_d0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    AddError(this,psVar3,&proto->super_Message,NAME,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != &local_100) {
      operator_delete(_Var8._M_p,local_100._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
  }
  FileDescriptorTables::AddEnumValueByNumber(this->file_tables_,result);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnumValue(const EnumValueDescriptorProto& proto,
                                       const EnumDescriptor* parent,
                                       EnumValueDescriptor* result) {
  result->name_   = tables_->AllocateString(proto.name());
  result->number_ = proto.number();
  result->type_   = parent;

  // Note:  full_name for enum values is a sibling to the parent's name, not a
  //   child of it.
  string* full_name = tables_->AllocateString(*parent->full_name_);
  full_name->resize(full_name->size() - parent->name_->size());
  full_name->append(*result->name_);
  result->full_name_ = full_name;

  ValidateSymbolName(proto.name(), *full_name, proto);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Again, enum values are weird because we makes them appear as siblings
  // of the enum type instead of children of it.  So, we use
  // parent->containing_type() as the value's parent.
  bool added_to_outer_scope =
    AddSymbol(result->full_name(), parent->containing_type(), result->name(),
              proto, Symbol(result));

  // However, we also want to be able to search for values within a single
  // enum type, so we add it as a child of the enum type itself, too.
  // Note:  This could fail, but if it does, the error has already been
  //   reported by the above AddSymbol() call, so we ignore the return code.
  bool added_to_inner_scope =
    file_tables_->AddAliasUnderParent(parent, result->name(), Symbol(result));

  if (added_to_inner_scope && !added_to_outer_scope) {
    // This value did not conflict with any values defined in the same enum,
    // but it did conflict with some other symbol defined in the enum type's
    // scope.  Let's print an additional error to explain this.
    string outer_scope;
    if (parent->containing_type() == NULL) {
      outer_scope = file_->package();
    } else {
      outer_scope = parent->containing_type()->full_name();
    }

    if (outer_scope.empty()) {
      outer_scope = "the global scope";
    } else {
      outer_scope = "\"" + outer_scope + "\"";
    }

    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Note that enum values use C++ scoping rules, meaning that "
             "enum values are siblings of their type, not children of it.  "
             "Therefore, \"" + result->name() + "\" must be unique within "
             + outer_scope + ", not just within \"" + parent->name() + "\".");
  }

  // An enum is allowed to define two numbers that refer to the same value.
  // FindValueByNumber() should return the first such value, so we simply
  // ignore AddEnumValueByNumber()'s return code.
  file_tables_->AddEnumValueByNumber(result);
}